

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffgrsz(fitsfile *fptr,long *ndata,int *status)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  ulong uVar5;
  int typecode;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_001087ec;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffgtcl(fptr,2,&local_24,(long *)0x0,(long *)0x0,status);
    lVar4 = (long)(int)(0x1b6c0 / (long)(local_24 / 10));
  }
  else {
    uVar1 = fptr->Fptr->rowlength;
    uVar5 = 1;
    if (1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    lVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1b6c0)) / auVar2,0);
    *ndata = lVar4;
    if (0x1b6c0 < (long)uVar1) {
      lVar4 = 1;
    }
  }
  *ndata = lVar4;
LAB_001087ec:
  return *status;
}

Assistant:

int ffgrsz( fitsfile *fptr, /* I - FITS file pionter                        */
            long *ndata,    /* O - optimal amount of data to access         */
            int  *status)   /* IO - error status                            */
/*
  Returns an optimal value for the number of rows in a binary table
  or the number of pixels in an image that should be read or written
  at one time for maximum efficiency. Accessing more data than this
  may cause excessive flushing and rereading of buffers to/from disk.
*/
{
    int typecode, bytesperpixel;

    /* There are NIOBUF internal buffers available each IOBUFLEN bytes long. */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
      if ( ffrdef(fptr, status) > 0)   /* rescan header to get hdu struct */
           return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU ) /* calc pixels per buffer size */
    {
      /* image pixels are in column 2 of the 'table' */
      ffgtcl(fptr, 2, &typecode, NULL, NULL, status);
      bytesperpixel = typecode / 10;
      *ndata = ((NIOBUF - 1) * IOBUFLEN) / bytesperpixel;
    }
    else   /* calc number of rows that fit in buffers */
    {
      *ndata = (long) (((NIOBUF - 1) * IOBUFLEN) / maxvalue(1,
               (fptr->Fptr)->rowlength));
      *ndata = maxvalue(1, *ndata); 
    }

    return(*status);
}